

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void last_valueInvFunc(sqlite3_context *pCtx,int nArg,sqlite3_value **apArg)

{
  undefined8 *puVar1;
  LastValueCtx *p;
  sqlite3_value **apArg_local;
  int nArg_local;
  sqlite3_context *pCtx_local;
  
  puVar1 = (undefined8 *)sqlite3_aggregate_context(pCtx,0x10);
  if ((puVar1 != (undefined8 *)0x0) &&
     (*(int *)(puVar1 + 1) = *(int *)(puVar1 + 1) + -1, *(int *)(puVar1 + 1) == 0)) {
    sqlite3_value_free((sqlite3_value *)*puVar1);
    *puVar1 = 0;
  }
  return;
}

Assistant:

static void last_valueInvFunc(
  sqlite3_context *pCtx, 
  int nArg,
  sqlite3_value **apArg
){
  struct LastValueCtx *p;
  UNUSED_PARAMETER(nArg);
  UNUSED_PARAMETER(apArg);
  p = (struct LastValueCtx*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( ALWAYS(p) ){
    p->nVal--;
    if( p->nVal==0 ){
      sqlite3_value_free(p->pVal);
      p->pVal = 0;
    }
  }
}